

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O3

Resource * __thiscall tcu::DirArchive::getResource(DirArchive *this,char *name)

{
  pointer pcVar1;
  FileResource *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = (FileResource *)operator_new(0x30);
  pcVar1 = (this->m_path)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_path)._M_string_length);
  std::__cxx11::string::append((char *)local_40);
  FileResource::FileResource(this_00,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return &this_00->super_Resource;
}

Assistant:

Resource* DirArchive::getResource (const char* name) const
{
	return static_cast<Resource*>(new FileResource((m_path + name).c_str()));
}